

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O0

bool __thiscall
draco::KdTreeAttributesDecoder::DecodeDataNeededByPortableTransforms
          (KdTreeAttributesDecoder *this,DecoderBuffer *in_buffer)

{
  value_type vVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  DataType DVar7;
  undefined4 uVar8;
  PointCloudDecoder *pPVar9;
  size_type sVar10;
  ulong uVar11;
  reference pvVar12;
  PointCloud *this_00;
  PointAttribute *num_attribute_values;
  __tuple_element_t<4UL,_tuple<PointAttribute_*,_unsigned_int,_DataType,_unsigned_int,_unsigned_int>_>
  *p_Var13;
  DynamicIntegerPointsKdTreeDecoder<4> *this_01;
  DecoderBuffer *in_RSI;
  long *in_RDI;
  DynamicIntegerPointsKdTreeDecoder<6> decoder_7;
  DynamicIntegerPointsKdTreeDecoder<5> decoder_6;
  DynamicIntegerPointsKdTreeDecoder<4> decoder_5;
  DynamicIntegerPointsKdTreeDecoder<3> decoder_4;
  DynamicIntegerPointsKdTreeDecoder<2> decoder_3;
  DynamicIntegerPointsKdTreeDecoder<1> decoder_2;
  DynamicIntegerPointsKdTreeDecoder<0> decoder_1;
  PointAttributeVectorOutputIterator<unsigned_int> out_it_1;
  PointAttribute *attr;
  int att_id_3;
  int attribute_index_1;
  uint32_t num_points_1;
  uint8_t compression_level_1;
  PointAttributeVectorOutputIterator<float> out_it;
  FloatPointsTreeDecoder decoder;
  uint32_t num_points;
  uint8_t compression_level;
  uint8_t method;
  PointAttribute *att;
  int att_id;
  uint32_t num_components_1;
  uint32_t data_size;
  DataType data_type;
  PointAttribute *att_2;
  int att_id_2;
  int attribute_index;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  atts;
  uint32_t total_dimensionality;
  uint32_t attribute_count;
  int32_t val;
  int i_1;
  int num_transforms;
  AttributeQuantizationTransform transform;
  uint8_t quantization_bits;
  float max_value_dif;
  int num_components;
  PointAttribute *att_1;
  int att_id_1;
  int i;
  vector<float,_std::allocator<float>_> min_value;
  undefined1 in_stack_ffffffffffffed18;
  undefined1 in_stack_ffffffffffffed19;
  undefined1 in_stack_ffffffffffffed1a;
  undefined1 in_stack_ffffffffffffed1b;
  undefined1 in_stack_ffffffffffffed1c;
  undefined1 in_stack_ffffffffffffed1d;
  undefined1 in_stack_ffffffffffffed1e;
  undefined1 in_stack_ffffffffffffed1f;
  PointCloud *in_stack_ffffffffffffed20;
  DecoderBuffer *in_stack_ffffffffffffed28;
  PointCloud *in_stack_ffffffffffffed30;
  PointCloudDecoder *in_stack_ffffffffffffed38;
  undefined4 in_stack_ffffffffffffed40;
  undefined4 in_stack_ffffffffffffed44;
  PointAttribute *in_stack_ffffffffffffed58;
  AttributeTransform *in_stack_ffffffffffffed60;
  undefined4 in_stack_ffffffffffffed6c;
  PointAttributeVectorOutputIterator<float> *in_stack_ffffffffffffed70;
  int32_t in_stack_ffffffffffffed78;
  DataType in_stack_ffffffffffffed7c;
  PointAttribute *in_stack_ffffffffffffed80;
  PointCloud *in_stack_ffffffffffffed88;
  uint32_t in_stack_ffffffffffffee1c;
  DynamicIntegerPointsKdTreeDecoder<4> *in_stack_ffffffffffffee20;
  uint local_184;
  FloatPointsTreeDecoder local_138;
  uint32_t local_120;
  undefined1 local_11a;
  char local_119;
  PointAttribute *local_118;
  undefined4 local_10c;
  uint local_ec;
  int32_t local_e8;
  int local_e4;
  uint local_e0;
  DataType local_dc;
  PointAttribute *local_d8;
  undefined4 local_cc;
  uint local_c8;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  local_c0;
  int local_a4;
  uint local_a0;
  value_type local_9c;
  int local_98;
  int local_94;
  byte local_5d;
  uint local_58;
  uint local_54;
  PointAttribute *local_50;
  undefined4 local_48;
  int local_34;
  vector<float,_std::allocator<float>_> local_30;
  byte local_1;
  
  uVar5 = DecoderBuffer::bitstream_version(in_RSI);
  if (0x202 < uVar5) {
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x1ec59f);
    for (local_34 = 0; iVar2 = local_34, iVar6 = (**(code **)(*in_RDI + 0x30))(), iVar2 < iVar6;
        local_34 = local_34 + 1) {
      local_48 = (**(code **)(*in_RDI + 0x28))(in_RDI,local_34);
      pPVar9 = (PointCloudDecoder *)(**(code **)(*in_RDI + 0x38))();
      PointCloudDecoder::point_cloud(pPVar9);
      local_50 = PointCloud::attribute
                           (in_stack_ffffffffffffed20,
                            CONCAT13(in_stack_ffffffffffffed1f,
                                     CONCAT12(in_stack_ffffffffffffed1e,
                                              CONCAT11(in_stack_ffffffffffffed1d,
                                                       in_stack_ffffffffffffed1c))));
      DVar7 = GeometryAttribute::data_type(&local_50->super_GeometryAttribute);
      if (DVar7 == DT_FLOAT32) {
        bVar3 = GeometryAttribute::num_components(&local_50->super_GeometryAttribute);
        local_54 = (uint)bVar3;
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                   (size_type)in_stack_ffffffffffffed38);
        std::vector<float,_std::allocator<float>_>::operator[](&local_30,0);
        bVar4 = DecoderBuffer::Decode
                          (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,
                           CONCAT17(in_stack_ffffffffffffed1f,
                                    CONCAT16(in_stack_ffffffffffffed1e,
                                             CONCAT15(in_stack_ffffffffffffed1d,
                                                      CONCAT14(in_stack_ffffffffffffed1c,
                                                               CONCAT13(in_stack_ffffffffffffed1b,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffed1a,
                                                  CONCAT11(in_stack_ffffffffffffed19,
                                                           in_stack_ffffffffffffed18))))))));
        if (!bVar4) {
          local_1 = 0;
          local_58 = 1;
          goto LAB_001eca43;
        }
        bVar4 = DecoderBuffer::Decode<float>
                          (in_stack_ffffffffffffed28,(float *)in_stack_ffffffffffffed20);
        if (!bVar4) {
          local_1 = 0;
          local_58 = 1;
          goto LAB_001eca43;
        }
        bVar4 = DecoderBuffer::Decode<unsigned_char>
                          (in_stack_ffffffffffffed28,(uchar *)in_stack_ffffffffffffed20);
        if ((!bVar4) || (0x1f < local_5d)) {
          local_1 = 0;
          local_58 = 1;
          goto LAB_001eca43;
        }
        AttributeQuantizationTransform::AttributeQuantizationTransform
                  ((AttributeQuantizationTransform *)in_stack_ffffffffffffed20);
        std::vector<float,_std::allocator<float>_>::data
                  ((vector<float,_std::allocator<float>_> *)0x1ec81d);
        bVar4 = AttributeQuantizationTransform::SetParameters
                          ((AttributeQuantizationTransform *)in_stack_ffffffffffffed38,
                           (int)((ulong)in_stack_ffffffffffffed30 >> 0x20),
                           (float *)in_stack_ffffffffffffed28,
                           (int)((ulong)in_stack_ffffffffffffed20 >> 0x20),
                           SUB84(in_stack_ffffffffffffed20,0));
        if (bVar4) {
          sVar10 = std::
                   vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                   ::size((vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                           *)(in_RDI + 9));
          local_94 = (int)sVar10;
          std::
          vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
          ::operator[]((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                        *)(in_RDI + 0xf),(long)local_94);
          std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::get
                    ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                      *)in_stack_ffffffffffffed20);
          bVar4 = AttributeTransform::TransferToAttribute
                            (in_stack_ffffffffffffed60,in_stack_ffffffffffffed58);
          if (bVar4) {
            std::
            vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
            ::push_back((vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                         *)in_stack_ffffffffffffed30,(value_type *)in_stack_ffffffffffffed28);
            local_58 = 0;
          }
          else {
            local_1 = 0;
            local_58 = 1;
          }
        }
        else {
          local_1 = 0;
          local_58 = 1;
        }
        AttributeQuantizationTransform::~AttributeQuantizationTransform
                  ((AttributeQuantizationTransform *)in_stack_ffffffffffffed20);
        if (local_58 != 0) goto LAB_001eca43;
      }
    }
    for (local_98 = 0; uVar11 = (ulong)local_98,
        sVar10 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc)), uVar11 < sVar10;
        local_98 = local_98 + 1) {
      bVar4 = DecodeVarint<int>((int *)in_stack_ffffffffffffed28,
                                (DecoderBuffer *)in_stack_ffffffffffffed20);
      vVar1 = local_9c;
      if (!bVar4) {
        local_1 = 0;
        local_58 = 1;
        goto LAB_001eca43;
      }
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)local_98);
      *pvVar12 = vVar1;
    }
    local_1 = 1;
    local_58 = 1;
LAB_001eca43:
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffed30);
    goto LAB_001ed6b9;
  }
  local_a0 = (**(code **)(*in_RDI + 0x30))();
  local_a4 = 0;
  std::
  allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>
  ::allocator((allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>
               *)0x1ecaae);
  std::
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
            *)CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
           (size_type)in_stack_ffffffffffffed38,(allocator_type *)in_stack_ffffffffffffed30);
  std::
  allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>
  ::~allocator((allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>
                *)0x1ecada);
  for (local_c8 = 0; local_c8 < local_a0; local_c8 = local_c8 + 1) {
    local_cc = (**(code **)(*in_RDI + 0x28))(in_RDI,local_c8);
    pPVar9 = (PointCloudDecoder *)(**(code **)(*in_RDI + 0x38))();
    in_stack_ffffffffffffed88 = PointCloudDecoder::point_cloud(pPVar9);
    in_stack_ffffffffffffed80 =
         PointCloud::attribute
                   (in_stack_ffffffffffffed20,
                    CONCAT13(in_stack_ffffffffffffed1f,
                             CONCAT12(in_stack_ffffffffffffed1e,
                                      CONCAT11(in_stack_ffffffffffffed1d,in_stack_ffffffffffffed1c))
                            ));
    local_d8 = in_stack_ffffffffffffed80;
    in_stack_ffffffffffffed7c =
         GeometryAttribute::data_type(&in_stack_ffffffffffffed80->super_GeometryAttribute);
    local_e4 = 0;
    local_dc = in_stack_ffffffffffffed7c;
    in_stack_ffffffffffffed78 = DataTypeLength(in_stack_ffffffffffffed7c);
    local_e8 = in_stack_ffffffffffffed78;
    in_stack_ffffffffffffed70 =
         (PointAttributeVectorOutputIterator<float> *)std::max<int>(&local_e4,&local_e8);
    local_e0 = *(uint *)&(in_stack_ffffffffffffed70->memory_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    bVar3 = GeometryAttribute::num_components(&local_d8->super_GeometryAttribute);
    in_stack_ffffffffffffed6c = CONCAT13(bVar3,(int3)in_stack_ffffffffffffed6c);
    local_ec = (uint)bVar3;
    if (4 < local_e0) {
      local_1 = 0;
      local_58 = 1;
      goto LAB_001ed69b;
    }
    std::
    make_tuple<draco::PointAttribute*const&,unsigned_int&,draco::DataType_const&,unsigned_int_const&,unsigned_int_const&>
              ((PointAttribute **)in_stack_ffffffffffffed38,(uint *)in_stack_ffffffffffffed30,
               (DataType *)in_stack_ffffffffffffed28,(uint *)in_stack_ffffffffffffed20,
               (uint *)CONCAT17(in_stack_ffffffffffffed1f,
                                CONCAT16(in_stack_ffffffffffffed1e,
                                         CONCAT15(in_stack_ffffffffffffed1d,
                                                  CONCAT14(in_stack_ffffffffffffed1c,
                                                           CONCAT13(in_stack_ffffffffffffed1b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffed1a,
                                                  CONCAT11(in_stack_ffffffffffffed19,
                                                           in_stack_ffffffffffffed18))))))));
    std::
    vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
    ::operator[](&local_c0,(long)(int)local_c8);
    std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>::
    operator=((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
               *)in_stack_ffffffffffffed20,
              (type)CONCAT17(in_stack_ffffffffffffed1f,
                             CONCAT16(in_stack_ffffffffffffed1e,
                                      CONCAT15(in_stack_ffffffffffffed1d,
                                               CONCAT14(in_stack_ffffffffffffed1c,
                                                        CONCAT13(in_stack_ffffffffffffed1b,
                                                                 CONCAT12(in_stack_ffffffffffffed1a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffed19,
                                                  in_stack_ffffffffffffed18))))))));
    local_a4 = local_ec + local_a4;
  }
  uVar8 = (**(code **)(*in_RDI + 0x28))(in_RDI,0);
  local_10c = uVar8;
  pPVar9 = (PointCloudDecoder *)(**(code **)(*in_RDI + 0x38))();
  this_00 = PointCloudDecoder::point_cloud(pPVar9);
  num_attribute_values =
       PointCloud::attribute
                 (in_stack_ffffffffffffed20,
                  CONCAT13(in_stack_ffffffffffffed1f,
                           CONCAT12(in_stack_ffffffffffffed1e,
                                    CONCAT11(in_stack_ffffffffffffed1d,in_stack_ffffffffffffed1c))))
  ;
  local_118 = num_attribute_values;
  PointAttribute::SetIdentityMapping((PointAttribute *)0x1ecd6e);
  bVar4 = DecoderBuffer::Decode<unsigned_char>
                    (in_stack_ffffffffffffed28,(uchar *)in_stack_ffffffffffffed20);
  if (bVar4) {
    if (local_119 == '\0') {
      sVar10 = std::
               vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
               ::size(&local_c0);
      if (sVar10 == 1) {
        std::
        vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
        ::operator[](&local_c0,0);
        p_Var13 = std::
                  get<4ul,draco::PointAttribute*,unsigned_int,draco::DataType,unsigned_int,unsigned_int>
                            ((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                              *)0x1ecdea);
        if (*p_Var13 == 3) {
          local_11a = 0;
          bVar4 = DecoderBuffer::Decode<unsigned_char>
                            (in_stack_ffffffffffffed28,(uchar *)in_stack_ffffffffffffed20);
          if (bVar4) {
            local_120 = 0;
            bVar4 = DecoderBuffer::Decode<unsigned_int>
                              (in_stack_ffffffffffffed28,(uint *)in_stack_ffffffffffffed20);
            if (bVar4) {
              PointAttribute::Reset((PointAttribute *)this_00,(size_t)num_attribute_values);
              FloatPointsTreeDecoder::FloatPointsTreeDecoder(&local_138);
              FloatPointsTreeDecoder::set_num_points_from_header(&local_138,local_120);
              PointAttributeVectorOutputIterator<float>::PointAttributeVectorOutputIterator
                        (in_stack_ffffffffffffed70,
                         (vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                          *)CONCAT44(in_stack_ffffffffffffed6c,uVar8));
              bVar4 = FloatPointsTreeDecoder::
                      DecodePointCloud<draco::PointAttributeVectorOutputIterator<float>>
                                ((FloatPointsTreeDecoder *)in_stack_ffffffffffffed88,
                                 (DecoderBuffer *)in_stack_ffffffffffffed80,
                                 (PointAttributeVectorOutputIterator<float> *)
                                 CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
              if (!bVar4) {
                local_1 = 0;
              }
              local_58 = (uint)!bVar4;
              PointAttributeVectorOutputIterator<float>::~PointAttributeVectorOutputIterator
                        ((PointAttributeVectorOutputIterator<float> *)in_stack_ffffffffffffed20);
              goto joined_r0x001ed65c;
            }
            local_1 = 0;
            local_58 = 1;
          }
          else {
            local_1 = 0;
            local_58 = 1;
          }
          goto LAB_001ed69b;
        }
      }
      local_1 = 0;
      local_58 = 1;
    }
    else if (local_119 == '\x01') {
      bVar4 = DecoderBuffer::Decode<unsigned_char>
                        (in_stack_ffffffffffffed28,(uchar *)in_stack_ffffffffffffed20);
      if (bVar4) {
        bVar4 = DecoderBuffer::Decode<unsigned_int>
                          (in_stack_ffffffffffffed28,(uint *)in_stack_ffffffffffffed20);
        if (bVar4) {
          for (local_184 = 0; local_184 < local_a0; local_184 = local_184 + 1) {
            in_stack_ffffffffffffed44 = (**(code **)(*in_RDI + 0x28))(in_RDI,local_184);
            in_stack_ffffffffffffed38 = (PointCloudDecoder *)(**(code **)(*in_RDI + 0x38))();
            in_stack_ffffffffffffed30 = PointCloudDecoder::point_cloud(in_stack_ffffffffffffed38);
            PointCloud::attribute
                      (in_stack_ffffffffffffed20,
                       CONCAT13(in_stack_ffffffffffffed1f,
                                CONCAT12(in_stack_ffffffffffffed1e,
                                         CONCAT11(in_stack_ffffffffffffed1d,
                                                  in_stack_ffffffffffffed1c))));
            PointAttribute::Reset((PointAttribute *)this_00,(size_t)num_attribute_values);
            PointAttribute::SetIdentityMapping((PointAttribute *)0x1ed10d);
          }
          PointAttributeVectorOutputIterator<unsigned_int>::PointAttributeVectorOutputIterator
                    ((PointAttributeVectorOutputIterator<unsigned_int> *)in_stack_ffffffffffffed70,
                     (vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                      *)CONCAT44(in_stack_ffffffffffffed6c,uVar8));
          this_01 = (DynamicIntegerPointsKdTreeDecoder<4> *)0x0;
          switch(0x1ed16a) {
          case 0:
            DynamicIntegerPointsKdTreeDecoder<0>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<0> *)in_stack_ffffffffffffee20,
                       in_stack_ffffffffffffee1c);
            bVar4 = DynamicIntegerPointsKdTreeDecoder<0>::
                    DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                              ((DynamicIntegerPointsKdTreeDecoder<0> *)
                               CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                               (DecoderBuffer *)in_stack_ffffffffffffed38,
                               (PointAttributeVectorOutputIterator<unsigned_int> *)
                               in_stack_ffffffffffffed30);
            if (bVar4) {
              local_58 = 0xe;
            }
            else {
              local_1 = 0;
              local_58 = 1;
            }
            DynamicIntegerPointsKdTreeDecoder<0>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<0> *)this_01);
            break;
          case 1:
            DynamicIntegerPointsKdTreeDecoder<1>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<1> *)in_stack_ffffffffffffee20,
                       in_stack_ffffffffffffee1c);
            bVar4 = DynamicIntegerPointsKdTreeDecoder<1>::
                    DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                              ((DynamicIntegerPointsKdTreeDecoder<1> *)
                               CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                               (DecoderBuffer *)in_stack_ffffffffffffed38,
                               (PointAttributeVectorOutputIterator<unsigned_int> *)
                               in_stack_ffffffffffffed30);
            if (bVar4) {
              local_58 = 0xe;
            }
            else {
              local_1 = 0;
              local_58 = 1;
            }
            DynamicIntegerPointsKdTreeDecoder<1>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<1> *)this_01);
            break;
          case 2:
            DynamicIntegerPointsKdTreeDecoder<2>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<2> *)in_stack_ffffffffffffee20,
                       in_stack_ffffffffffffee1c);
            bVar4 = DynamicIntegerPointsKdTreeDecoder<2>::
                    DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                              ((DynamicIntegerPointsKdTreeDecoder<2> *)
                               CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                               (DecoderBuffer *)in_stack_ffffffffffffed38,
                               (PointAttributeVectorOutputIterator<unsigned_int> *)
                               in_stack_ffffffffffffed30);
            if (bVar4) {
              local_58 = 0xe;
            }
            else {
              local_1 = 0;
              local_58 = 1;
            }
            DynamicIntegerPointsKdTreeDecoder<2>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<2> *)this_01);
            break;
          case 3:
            DynamicIntegerPointsKdTreeDecoder<3>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<3> *)in_stack_ffffffffffffee20,
                       in_stack_ffffffffffffee1c);
            bVar4 = DynamicIntegerPointsKdTreeDecoder<3>::
                    DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                              ((DynamicIntegerPointsKdTreeDecoder<3> *)
                               CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                               (DecoderBuffer *)in_stack_ffffffffffffed38,
                               (PointAttributeVectorOutputIterator<unsigned_int> *)
                               in_stack_ffffffffffffed30);
            if (bVar4) {
              local_58 = 0xe;
            }
            else {
              local_1 = 0;
              local_58 = 1;
            }
            DynamicIntegerPointsKdTreeDecoder<3>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<3> *)this_01);
            break;
          case 4:
            DynamicIntegerPointsKdTreeDecoder<4>::DynamicIntegerPointsKdTreeDecoder
                      (in_stack_ffffffffffffee20,in_stack_ffffffffffffee1c);
            bVar4 = DynamicIntegerPointsKdTreeDecoder<4>::
                    DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                              ((DynamicIntegerPointsKdTreeDecoder<4> *)
                               CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                               (DecoderBuffer *)in_stack_ffffffffffffed38,
                               (PointAttributeVectorOutputIterator<unsigned_int> *)
                               in_stack_ffffffffffffed30);
            if (bVar4) {
              local_58 = 0xe;
            }
            else {
              local_1 = 0;
              local_58 = 1;
            }
            DynamicIntegerPointsKdTreeDecoder<4>::~DynamicIntegerPointsKdTreeDecoder(this_01);
            break;
          case 5:
            DynamicIntegerPointsKdTreeDecoder<5>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<5> *)in_stack_ffffffffffffee20,
                       in_stack_ffffffffffffee1c);
            bVar4 = DynamicIntegerPointsKdTreeDecoder<5>::
                    DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                              ((DynamicIntegerPointsKdTreeDecoder<5> *)
                               CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                               (DecoderBuffer *)in_stack_ffffffffffffed38,
                               (PointAttributeVectorOutputIterator<unsigned_int> *)
                               in_stack_ffffffffffffed30);
            if (bVar4) {
              local_58 = 0xe;
            }
            else {
              local_1 = 0;
              local_58 = 1;
            }
            DynamicIntegerPointsKdTreeDecoder<5>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<5> *)this_01);
            break;
          case 6:
            DynamicIntegerPointsKdTreeDecoder<6>::DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<6> *)in_stack_ffffffffffffee20,
                       in_stack_ffffffffffffee1c);
            bVar4 = DynamicIntegerPointsKdTreeDecoder<6>::
                    DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                              ((DynamicIntegerPointsKdTreeDecoder<6> *)
                               CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                               (DecoderBuffer *)in_stack_ffffffffffffed38,
                               (PointAttributeVectorOutputIterator<unsigned_int> *)
                               in_stack_ffffffffffffed30);
            if (bVar4) {
              local_58 = 0xe;
            }
            else {
              local_1 = 0;
              local_58 = 1;
            }
            DynamicIntegerPointsKdTreeDecoder<6>::~DynamicIntegerPointsKdTreeDecoder
                      ((DynamicIntegerPointsKdTreeDecoder<6> *)this_01);
          }
          if (local_58 == 0xe) {
            local_58 = 0;
          }
          PointAttributeVectorOutputIterator<unsigned_int>::~PointAttributeVectorOutputIterator
                    ((PointAttributeVectorOutputIterator<unsigned_int> *)this_01);
joined_r0x001ed65c:
          if (local_58 == 0) {
            local_1 = 1;
            local_58 = 1;
          }
        }
        else {
          local_1 = 0;
          local_58 = 1;
        }
      }
      else {
        local_1 = 0;
        local_58 = 1;
      }
    }
    else {
      local_1 = 0;
      local_58 = 1;
    }
  }
  else {
    local_1 = 0;
    local_58 = 1;
  }
LAB_001ed69b:
  std::
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
             *)in_stack_ffffffffffffed30);
LAB_001ed6b9:
  return (bool)(local_1 & 1);
}

Assistant:

bool KdTreeAttributesDecoder::DecodeDataNeededByPortableTransforms(
    DecoderBuffer *in_buffer) {
  if (in_buffer->bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 3)) {
    // Decode quantization data for each attribute that need it.
    // TODO(ostava): This should be moved to AttributeQuantizationTransform.
    std::vector<float> min_value;
    for (int i = 0; i < GetNumAttributes(); ++i) {
      const int att_id = GetAttributeId(i);
      const PointAttribute *const att =
          GetDecoder()->point_cloud()->attribute(att_id);
      if (att->data_type() == DT_FLOAT32) {
        const int num_components = att->num_components();
        min_value.resize(num_components);
        if (!in_buffer->Decode(&min_value[0], sizeof(float) * num_components)) {
          return false;
        }
        float max_value_dif;
        if (!in_buffer->Decode(&max_value_dif)) {
          return false;
        }
        uint8_t quantization_bits;
        if (!in_buffer->Decode(&quantization_bits) || quantization_bits > 31) {
          return false;
        }
        AttributeQuantizationTransform transform;
        if (!transform.SetParameters(quantization_bits, min_value.data(),
                                     num_components, max_value_dif)) {
          return false;
        }
        const int num_transforms =
            static_cast<int>(attribute_quantization_transforms_.size());
        if (!transform.TransferToAttribute(
                quantized_portable_attributes_[num_transforms].get())) {
          return false;
        }
        attribute_quantization_transforms_.push_back(transform);
      }
    }

    // Decode transform data for signed integer attributes.
    for (int i = 0; i < min_signed_values_.size(); ++i) {
      int32_t val;
      if (!DecodeVarint(&val, in_buffer)) {
        return false;
      }
      min_signed_values_[i] = val;
    }
    return true;
  }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  // Handle old bitstream
  // Figure out the total dimensionality of the point cloud
  const uint32_t attribute_count = GetNumAttributes();
  uint32_t total_dimensionality = 0;  // position is a required dimension
  std::vector<AttributeTuple> atts(attribute_count);
  for (auto attribute_index = 0;
       static_cast<uint32_t>(attribute_index) < attribute_count;
       attribute_index += 1)  // increment the dimensionality as needed...
  {
    const int att_id = GetAttributeId(attribute_index);
    PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
    const DataType data_type = att->data_type();
    const uint32_t data_size = (std::max)(0, DataTypeLength(data_type));
    const uint32_t num_components = att->num_components();
    if (data_size > 4) {
      return false;
    }

    atts[attribute_index] = std::make_tuple(
        att, total_dimensionality, data_type, data_size, num_components);
    // everything is treated as 32bit in the encoder.
    total_dimensionality += num_components;
  }

  const int att_id = GetAttributeId(0);
  PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
  att->SetIdentityMapping();
  // Decode method
  uint8_t method;
  if (!in_buffer->Decode(&method)) {
    return false;
  }
  if (method == KdTreeAttributesEncodingMethod::kKdTreeQuantizationEncoding) {
    // This method only supports one attribute with exactly three components.
    if (atts.size() != 1 || std::get<4>(atts[0]) != 3) {
      return false;
    }
    uint8_t compression_level = 0;
    if (!in_buffer->Decode(&compression_level)) {
      return false;
    }
    uint32_t num_points = 0;
    if (!in_buffer->Decode(&num_points)) {
      return false;
    }
    att->Reset(num_points);
    FloatPointsTreeDecoder decoder;
    decoder.set_num_points_from_header(num_points);
    PointAttributeVectorOutputIterator<float> out_it(atts);
    if (!decoder.DecodePointCloud(in_buffer, out_it)) {
      return false;
    }
  } else if (method == KdTreeAttributesEncodingMethod::kKdTreeIntegerEncoding) {
    uint8_t compression_level = 0;
    if (!in_buffer->Decode(&compression_level)) {
      return false;
    }
    if (6 < compression_level) {
      DRACO_LOGE(
          "KdTreeAttributesDecoder: compression level %i not supported.\n",
          compression_level);
      return false;
    }

    uint32_t num_points;
    if (!in_buffer->Decode(&num_points)) {
      return false;
    }

    for (auto attribute_index = 0;
         static_cast<uint32_t>(attribute_index) < attribute_count;
         attribute_index += 1) {
      const int att_id = GetAttributeId(attribute_index);
      PointAttribute *const attr =
          GetDecoder()->point_cloud()->attribute(att_id);
      attr->Reset(num_points);
      attr->SetIdentityMapping();
    }

    PointAttributeVectorOutputIterator<uint32_t> out_it(atts);

    switch (compression_level) {
      case 0: {
        DynamicIntegerPointsKdTreeDecoder<0> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 1: {
        DynamicIntegerPointsKdTreeDecoder<1> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 2: {
        DynamicIntegerPointsKdTreeDecoder<2> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 3: {
        DynamicIntegerPointsKdTreeDecoder<3> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 4: {
        DynamicIntegerPointsKdTreeDecoder<4> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 5: {
        DynamicIntegerPointsKdTreeDecoder<5> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 6: {
        DynamicIntegerPointsKdTreeDecoder<6> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      default:
        return false;
    }
  } else {
    // Invalid method.
    return false;
  }
  return true;
#else
  return false;
#endif
}